

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice_detection_impl.cc
# Opt level: O0

int __thiscall webrtc::VoiceDetectionImpl::set_frame_size_ms(VoiceDetectionImpl *this,int size)

{
  FatalMessage local_1b0;
  string *local_28;
  string *_result;
  CritScope cs;
  int size_local;
  VoiceDetectionImpl *this_local;
  
  cs.cs_._4_4_ = size;
  rtc::CritScope::CritScope((CritScope *)&_result,this->crit_);
  local_28 = rtc::CheckEQImpl_abi_cxx11_(10,cs.cs_._4_4_,"10 == size");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
               ,0x90,local_28);
    rtc::FatalMessage::stream(&local_1b0);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  this->frame_size_ms_ = cs.cs_._4_4_;
  Initialize(this,this->sample_rate_hz_);
  rtc::CritScope::~CritScope((CritScope *)&_result);
  return 0;
}

Assistant:

int VoiceDetectionImpl::set_frame_size_ms(int size) {
  rtc::CritScope cs(crit_);
  RTC_DCHECK_EQ(10, size); // TODO(ajm): remove when supported.
  frame_size_ms_ = size;
  Initialize(sample_rate_hz_);
  return AudioProcessing::kNoError;
}